

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemporaryObject.cpp
# Opt level: O3

EvaluationResult __thiscall
chatra::TemporaryObject::evaluateDirect(TemporaryObject *this,bool throwIfNotFound)

{
  pointer ppCVar1;
  Reference RVar2;
  pointer pAVar3;
  Thread *pTVar4;
  pointer pbVar5;
  pointer pcVar6;
  Node *pNVar7;
  bool bVar8;
  byte bVar9;
  Class *pCVar10;
  undefined8 *puVar11;
  vector<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_> *args;
  StringId SVar12;
  pointer ppCVar13;
  pointer ppCVar14;
  pointer_____offset_0x10___ *ppuVar15;
  _Alloc_hider _Var16;
  ulong uVar17;
  long lVar18;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  string local_c0;
  string local_a0;
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  Node *local_60;
  string local_58;
  allocator_type local_31;
  
  switch(this->type) {
  case Rvalue:
  case ScopeRef:
  case ObjectRef:
  case Self:
    RVar2.node = (this->targetRef).node;
    pCVar10 = (Class *)(RVar2.node)->object[1]._vptr_Object;
    bVar8 = findOnObject(this,RVar2,&pCVar10->methods,(Class *)0x0,Invalid);
    if (bVar8) {
      return Succeeded;
    }
    break;
  case Package:
    pCVar10 = Package::findClass(this->package,this->name);
    if (pCVar10 != (Class *)0x0) {
      if (this->hasArgs == false) {
        this->type = Class;
        (this->targetRef).node = (ReferenceNode *)0x0;
        this->cl = pCVar10;
        goto LAB_0014db44;
      }
      bVar8 = findConstructor(this,pCVar10,Invalid);
      if (bVar8) {
        return Succeeded;
      }
    }
    bVar8 = findOnPackage(this,this->package);
    if (bVar8) {
      return Succeeded;
    }
    pCVar10 = (Class *)0x0;
    break;
  case Class:
    if (this->hasArgs != false) {
      SVar12 = Invalid;
      if (this->hasName != false) {
        SVar12 = this->name;
      }
      bVar8 = findConstructor(this,this->cl,SVar12);
      if (bVar8) {
        return Succeeded;
      }
      pNVar7 = this->node;
      if (pNVar7 != (Node *)0x0) {
        pTVar4 = this->thread;
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c0,"constructor not found","");
        local_58._M_dataplus._M_p = (pointer)0x0;
        local_58._M_string_length = 0;
        local_58.field_2._M_allocated_capacity = 0;
        errorAtNode(&pTVar4->super_IErrorReceiver,Error,pNVar7,&local_c0,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_58);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_58);
        _Var16._M_p = local_c0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p == &local_c0.field_2) goto LAB_0014ddf1;
        goto LAB_0014ddec;
      }
      goto LAB_0014ddf1;
    }
    pNVar7 = this->node;
    if (pNVar7 != (Node *)0x0) {
      pTVar4 = this->thread;
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c0,"cannot use element selection operator on a class","");
      local_58._M_dataplus._M_p = (pointer)0x0;
      local_58._M_string_length = 0;
      local_58.field_2._M_allocated_capacity = 0;
      errorAtNode(&pTVar4->super_IErrorReceiver,Error,pNVar7,&local_c0,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_58);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p);
      }
    }
    puVar11 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar11 = &PTR__exception_00243b18;
    *(undefined4 *)(puVar11 + 1) = 0x83;
    goto LAB_0014de0c;
  default:
    puVar11 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar11 = &PTR__exception_00243be0;
    ppuVar15 = &InternalError::typeinfo;
    goto LAB_0014de13;
  case Super:
    bVar9 = this->hasName;
    if ((bool)bVar9 == true) {
      ppCVar14 = (this->cl->directParents).
                 super__Vector_base<const_chatra::Class_*,_std::allocator<const_chatra::Class_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppCVar1 = (this->cl->directParents).
                super__Vector_base<const_chatra::Class_*,_std::allocator<const_chatra::Class_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      SVar12 = this->name;
      uVar17 = (long)ppCVar1 - (long)ppCVar14;
      if (0 < (long)uVar17 >> 5) {
        ppCVar13 = (pointer)((uVar17 & 0xffffffffffffffe0) + (long)ppCVar14);
        lVar18 = ((long)uVar17 >> 5) + 1;
        ppCVar14 = ppCVar14 + 2;
        do {
          if (ppCVar14[-2]->name == SVar12) {
            ppCVar14 = ppCVar14 + -2;
            goto LAB_0014da46;
          }
          if (ppCVar14[-1]->name == SVar12) {
            ppCVar14 = ppCVar14 + -1;
            goto LAB_0014da46;
          }
          if ((*ppCVar14)->name == SVar12) goto LAB_0014da46;
          if (ppCVar14[1]->name == SVar12) {
            ppCVar14 = ppCVar14 + 1;
            goto LAB_0014da46;
          }
          lVar18 = lVar18 + -1;
          ppCVar14 = ppCVar14 + 4;
        } while (1 < lVar18);
        uVar17 = (long)ppCVar1 - (long)ppCVar13;
        ppCVar14 = ppCVar13;
      }
      lVar18 = (long)uVar17 >> 3;
      if (lVar18 == 1) {
LAB_0014da27:
        if ((*ppCVar14)->name != SVar12) {
          ppCVar14 = ppCVar1;
        }
      }
      else if (lVar18 == 2) {
LAB_0014da1b:
        if ((*ppCVar14)->name != SVar12) {
          ppCVar14 = ppCVar14 + 1;
          goto LAB_0014da27;
        }
      }
      else {
        if (lVar18 != 3) goto LAB_0014da7d;
        if ((*ppCVar14)->name != SVar12) {
          ppCVar14 = ppCVar14 + 1;
          goto LAB_0014da1b;
        }
      }
LAB_0014da46:
      if (ppCVar14 != ppCVar1) {
        pCVar10 = *ppCVar14;
        RVar2.node = (this->targetRef).node;
        if (this->hasArgs == false) {
          this->type = ExplicitSuper;
          (this->targetRef).node = RVar2.node;
          this->cl = pCVar10;
LAB_0014db44:
          this->hasName = false;
          this->hasArgs = false;
          this->hasSetArg = false;
          this->hasVarArgOp = false;
          pAVar3 = (this->args).
                   super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if ((this->args).
              super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>.
              _M_impl.super__Vector_impl_data._M_finish != pAVar3) {
            (this->args).
            super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>._M_impl.
            super__Vector_impl_data._M_finish = pAVar3;
            return Succeeded;
          }
          return Succeeded;
        }
        bVar8 = findConstructorCall(this,RVar2,pCVar10,Invalid);
        if (bVar8) {
          return Succeeded;
        }
        bVar9 = this->hasName;
      }
    }
LAB_0014da7d:
    if (((bVar9 & 1) != 0) && (this->hasArgs == true)) {
      ppCVar1 = (this->cl->directParents).
                super__Vector_base<const_chatra::Class_*,_std::allocator<const_chatra::Class_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppCVar14 = (this->cl->directParents).
                      super__Vector_base<const_chatra::Class_*,_std::allocator<const_chatra::Class_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppCVar14 != ppCVar1;
          ppCVar14 = ppCVar14 + 1) {
        bVar8 = findConstructorCall(this,(this->targetRef).node,*ppCVar14,this->name);
        if (bVar8) {
          return Succeeded;
        }
      }
    }
    bVar8 = findOnObject(this,(this->targetRef).node,&this->cl->superMethods,(Class *)0x0,Invalid);
    if (bVar8) {
      return Succeeded;
    }
    goto LAB_0014daee;
  case ExplicitSuper:
    if (((this->hasName == true) && (this->hasArgs == true)) &&
       (bVar8 = findConstructorCall(this,(this->targetRef).node,this->cl,this->name), bVar8)) {
      return Succeeded;
    }
    bVar8 = findOnObject(this,(this->targetRef).node,&this->cl->methods,this->cl,Invalid);
    if (bVar8) {
      return Succeeded;
    }
LAB_0014daee:
    pCVar10 = this->cl;
  }
  bVar8 = partialEvaluation(this,0xffffffffffffffff,pCVar10);
  if (!throwIfNotFound || bVar8) {
    return bVar8 + Failed;
  }
  pTVar4 = this->thread;
  local_60 = this->node;
  if (pCVar10 == (Class *)0x0) {
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"expected expression","");
    local_58._M_dataplus._M_p = (pointer)0x0;
    local_58._M_string_length = 0;
    local_58.field_2._M_allocated_capacity = 0;
    errorAtNode(&pTVar4->super_IErrorReceiver,Error,local_60,&local_c0,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_58);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_58);
    _Var16._M_p = local_c0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
LAB_0014ddec:
      operator_delete(_Var16._M_p);
    }
  }
  else {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"no method or member named \"${0}${1}\" in class \"${2}\"","");
    pbVar5 = (this->thread->sTable->idToStr).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    args = (vector<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_> *)
           ((ulong)this->name * 0x20);
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    lVar18 = *(long *)((long)&(args->
                              super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>
                              )._M_impl.super__Vector_impl_data._M_start + (long)pbVar5);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c0,lVar18,
               *(long *)((long)&(args->
                                super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>
                                )._M_impl.super__Vector_impl_data._M_finish + (long)pbVar5) + lVar18
              );
    toString_abi_cxx11_(&local_a0,(chatra *)this->thread->sTable,(StringTable *)&this->args,args);
    pbVar5 = (this->thread->sTable->idToStr).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_80[0] = local_70;
    pcVar6 = pbVar5[pCVar10->name]._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_80,pcVar6,pcVar6 + pbVar5[pCVar10->name]._M_string_length);
    __l._M_len = 3;
    __l._M_array = &local_c0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_d8,__l,&local_31);
    errorAtNode(&pTVar4->super_IErrorReceiver,Error,local_60,&local_58,&local_d8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_d8);
    lVar18 = 0;
    do {
      if (local_70 + lVar18 != *(undefined1 **)((long)local_80 + lVar18)) {
        operator_delete(*(undefined1 **)((long)local_80 + lVar18));
      }
      lVar18 = lVar18 + -0x20;
    } while (lVar18 != -0x60);
    _Var16._M_p = local_58._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) goto LAB_0014ddec;
  }
LAB_0014ddf1:
  puVar11 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar11 = &PTR__exception_00243b18;
  *(undefined4 *)(puVar11 + 1) = 0x86;
LAB_0014de0c:
  ppuVar15 = &RuntimeException::typeinfo;
LAB_0014de13:
  __cxa_throw(puVar11,ppuVar15,std::exception::~exception);
}

Assistant:

TemporaryObject::EvaluationResult TemporaryObject::evaluateDirect(bool throwIfNotFound) {
	const Class* clTarget;
	switch (type) {
	case Type::Rvalue:
		clTarget = targetRef.deref<ObjectBase>().getClass();
		if (findOnObject(targetRef, clTarget->refMethods(), nullptr))
			return EvaluationResult::Succeeded;
		break;

	case Type::Package: {
		auto* cl = package->findClass(name);
		if (cl != nullptr) {
			if (!hasArgs) {
				setClass(cl);
				return EvaluationResult::Succeeded;
			}
			if (findConstructor(cl, StringId::Invalid))
				return EvaluationResult::Succeeded;
		}

		if (findOnPackage(package))
			return EvaluationResult::Succeeded;

		clTarget = nullptr;
		break;
	}

	case Type::Class: {
		if (!hasArgs) {
			if (node != nullptr)
				errorAtNode(thread, ErrorLevel::Error, node, "cannot use element selection operator on a class", {});
			throw RuntimeException(StringId::UnsupportedOperationException);
		}
		if (findConstructor(cl, hasName ? name : StringId::Invalid))
			return EvaluationResult::Succeeded;

		if (node != nullptr)
			errorAtNode(thread, ErrorLevel::Error, node, "constructor not found", {});
		throw RuntimeException(StringId::MemberNotFoundException);
	}

	case Type::Constructor:
	case Type::FrameMethod:
	case Type::ObjectMethod:
		throw InternalError();

	case Type::ScopeRef:
	case Type::ObjectRef:
	case Type::Self:
		clTarget = targetRef.deref<ObjectBase>().getClass();
		if (findOnObject(targetRef, clTarget->refMethods(), nullptr))
			return EvaluationResult::Succeeded;
		break;

	case Type::Super: {
		// check "super.Class" or "super.Class()" style
		if (hasName) {
			auto& clParents = cl->refDirectParents();
			auto it = std::find_if(clParents.cbegin(), clParents.cend(), [&](const Class* clParent) {
				return clParent->getName() == name; });
			if (it != clParents.cend()) {
				auto* clParent = *it;

				if (!hasArgs) {
					setExplicitSuper(targetRef, clParent);
					return EvaluationResult::Succeeded;
				}
				if (findConstructorCall(targetRef, clParent, StringId::Invalid))
					return EvaluationResult::Succeeded;
			}
		}

		// check "super.constructor()" style
		if (hasName && hasArgs) {
			for (auto* clParent : cl->refDirectParents()) {
				if (findConstructorCall(targetRef, clParent, name))
					return EvaluationResult::Succeeded;
			}
		}

		if (findOnObject(targetRef, cl->refSuperMethods(), nullptr))
			return EvaluationResult::Succeeded;

		clTarget = cl;
		break;
	}

	case Type::ExplicitSuper: {
		// check "super.Class.constructor()" style
		if (hasName && hasArgs && findConstructorCall(targetRef, cl, name))
			return EvaluationResult::Succeeded;

		if (findOnObject(targetRef, cl->refMethods(), cl))
			return EvaluationResult::Succeeded;
		clTarget = cl;
		break;
	}

	default:
		throw InternalError();
	}

	if (partialEvaluation(SIZE_MAX, clTarget))
		return EvaluationResult::Partial;

	if (throwIfNotFound) {
		if (clTarget == nullptr)
			errorAtNode(thread, ErrorLevel::Error, node, "expected expression", {});
		else {
			errorAtNode(thread, ErrorLevel::Error, node, R"*(no method or member named "${0}${1}" in class "${2}")*",
					{thread.sTable->ref(name), toString(thread.sTable, args), thread.sTable->ref(clTarget->getName())});
		}
		throw RuntimeException(StringId::MemberNotFoundException);
	}

	return EvaluationResult::Failed;
}